

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O1

void test_contains_all_different_sizes(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *bitset_00;
  
  bitset = bitset_create_with_capacity(10);
  bitset_00 = bitset_create_with_capacity(5);
  if (bitset->arraysize == 0) {
    _Var1 = bitset_grow(bitset,1);
    if (_Var1) goto LAB_0010386b;
  }
  else {
LAB_0010386b:
    *bitset->array = *bitset->array | 2;
  }
  if (bitset->arraysize == 0) {
    _Var1 = bitset_grow(bitset,1);
    if (_Var1) goto LAB_0010388a;
  }
  else {
LAB_0010388a:
    *bitset->array = *bitset->array | 0x10;
  }
  if (bitset->arraysize == 0) {
    _Var1 = bitset_grow(bitset,1);
    if (_Var1) goto LAB_001038a9;
  }
  else {
LAB_001038a9:
    *bitset->array = *bitset->array | 0x40;
  }
  if (bitset_00->arraysize == 0) {
    _Var1 = bitset_grow(bitset_00,1);
    if (_Var1) goto LAB_001038c8;
  }
  else {
LAB_001038c8:
    *bitset_00->array = *bitset_00->array | 2;
  }
  if (bitset_00->arraysize == 0) {
    _Var1 = bitset_grow(bitset_00,1);
    if (!_Var1) goto LAB_001038ee;
  }
  *bitset_00->array = *bitset_00->array | 0x10;
LAB_001038ee:
  _Var1 = bitset_contains_all(bitset,bitset_00);
  _assert_true((ulong)_Var1,"bitset_contains_all(superset, subset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x104);
  _Var1 = bitset_contains_all(bitset_00,bitset);
  _assert_true((ulong)!_Var1,"!bitset_contains_all(subset, superset)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0x105);
  bitset_free(bitset);
  bitset_free(bitset_00);
  return;
}

Assistant:

DEFINE_TEST(test_contains_all_different_sizes) {
    const size_t superset_size = 10;
    const size_t subset_size = 5;

    bitset_t *superset = bitset_create_with_capacity(superset_size);
    bitset_t *subset = bitset_create_with_capacity(subset_size);

    bitset_set(superset, 1);
    bitset_set(superset, subset_size - 1);
    bitset_set(superset, subset_size + 1);

    bitset_set(subset, 1);
    bitset_set(subset, subset_size - 1);

    assert_true(bitset_contains_all(superset, subset));
    assert_true(!bitset_contains_all(subset, superset));

    bitset_free(superset);
    bitset_free(subset);
}